

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyevent.c
# Opt level: O0

void kb_trans(u_short keycode,u_short upflg)

{
  ushort *puVar1;
  UNSIGNED real68kbase_3;
  UNSIGNED real68kbase_2;
  UNSIGNED real68kbase_1;
  UNSIGNED real68kbase;
  u_short upflg_local;
  u_short keycode_local;
  
  if (keycode < 0x40) {
    if (upflg == 0) {
      puVar1 = (ushort *)(((ulong)EmKbdAd068K ^ 2) + (long)((int)(uint)keycode >> 4) * 2 ^ 2);
      *puVar1 = *puVar1 & ((ushort)(1 << (0xfU - (char)((ulong)keycode % 0x10) & 0x1f)) ^ 0xffff);
    }
    else {
      puVar1 = (ushort *)(((ulong)EmKbdAd068K ^ 2) + (long)((int)(uint)keycode >> 4) * 2 ^ 2);
      *puVar1 = *puVar1 | (ushort)(1 << (0xfU - (char)((ulong)keycode % 0x10) & 0x1f));
    }
  }
  else if (keycode < 0x50) {
    if ((0x3f < keycode) && (keycode < 0x50)) {
      if (upflg == 0) {
        *EmRealUtilin68K =
             *EmRealUtilin68K &
             ((ushort)(1 << (0xfU - (char)((ulong)(keycode & 0xf) % 0x10) & 0x1f)) ^ 0xffff);
        *EmUtilin68K = *EmUtilin68K &
                       ((ushort)(1 << (0xfU - (char)((ulong)(keycode & 0xf) % 0x10) & 0x1f)) ^
                       0xffff);
      }
      else {
        *EmRealUtilin68K =
             *EmRealUtilin68K | (ushort)(1 << (0xfU - (char)((ulong)(keycode & 0xf) % 0x10) & 0x1f))
        ;
        *EmUtilin68K = *EmUtilin68K |
                       (ushort)(1 << (0xfU - (char)((ulong)(keycode & 0xf) % 0x10) & 0x1f));
      }
    }
  }
  else if (upflg == 0) {
    puVar1 = (ushort *)
             (((ulong)EmKbdAd068K ^ 2) + (long)((int)(keycode - 0x10 & 0xffff) >> 4) * 2 ^ 2);
    *puVar1 = *puVar1 & ((ushort)(1 << (0xfU - (char)((ulong)(keycode - 0x10 & 0xffff) % 0x10) &
                                       0x1f)) ^ 0xffff);
  }
  else {
    puVar1 = (ushort *)
             (((ulong)EmKbdAd068K ^ 2) + (long)((int)(keycode - 0x10 & 0xffff) >> 4) * 2 ^ 2);
    *puVar1 = *puVar1 | (ushort)(1 << (0xfU - (char)((ulong)(keycode - 0x10 & 0xffff) % 0x10) & 0x1f
                                      ));
  }
  return;
}

Assistant:

void kb_trans(u_short keycode, u_short upflg)
{
  if (keycode < 64) /* DLKBDAD0 ~ 3	*/
  {
    PUTBASEBIT68K(EmKbdAd068K, keycode, upflg);
  } else if (keycode >= 80) /* DLKBDAD4, 5	*/
  {
    PUTBASEBIT68K(EmKbdAd068K, keycode - 16, upflg);
  } else if (keycode >= 64 && keycode < 80) /* DLUTILIN	*/
  {
    PUTBASEBIT68K(EmRealUtilin68K, (keycode & 15), upflg);
    PUTBASEBIT68K(EmUtilin68K, (keycode & 15), upflg);
  }
}